

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSSerializerImpl.cpp
# Opt level: O1

ssize_t __thiscall
xercesc_4_0::DOMLSSerializerImpl::write(DOMLSSerializerImpl *this,int __fd,void *__buf,size_t __n)

{
  XMLCh XVar1;
  XMLCh XVar2;
  MemoryManager *manager;
  int iVar3;
  LocalFileFormatTarget *target;
  LocalFileFormatTarget *this_00;
  DOMNode *pDVar4;
  XMLCh *pXVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  XMLCh *pXVar6;
  XMLFormatter *this_01;
  ulong uVar7;
  undefined4 in_register_00000034;
  DOMNode *nodeToWrite;
  bool bVar8;
  undefined4 extraout_var;
  
  nodeToWrite = (DOMNode *)CONCAT44(in_register_00000034,__fd);
  pDVar4 = nodeToWrite;
  target = (LocalFileFormatTarget *)(**(code **)(*__buf + 0x10))(__buf);
  if (target == (LocalFileFormatTarget *)0x0) {
    pXVar5 = (XMLCh *)(**(code **)(*__buf + 0x20))(__buf);
    if (pXVar5 == (XMLCh *)0x0) {
      this_00 = (LocalFileFormatTarget *)0x0;
      uVar7 = 0;
      goto LAB_002886ef;
    }
    this_00 = (LocalFileFormatTarget *)XMemory::operator_new((XMemory *)0x30,(size_t)pDVar4);
    LocalFileFormatTarget::LocalFileFormatTarget(this_00,pXVar5,this->fMemoryManager);
    target = this_00;
  }
  else {
    this_00 = (LocalFileFormatTarget *)0x0;
  }
  this->fEncodingUsed = (XMLCh *)gUTF8;
  iVar3 = (*nodeToWrite->_vptr_DOMNode[4])(nodeToWrite);
  if (iVar3 == 9) {
    pDVar4 = nodeToWrite + -3;
  }
  else {
    iVar3 = (*nodeToWrite->_vptr_DOMNode[0xc])(nodeToWrite);
    pDVar4 = (DOMNode *)CONCAT44(extraout_var,iVar3);
  }
  pXVar5 = (XMLCh *)(**(code **)(*__buf + 0x18))(__buf);
  if ((pXVar5 == (XMLCh *)0x0) || (*pXVar5 == L'\0')) {
    if (pDVar4 != (DOMNode *)0x0) {
      iVar3 = (*pDVar4->_vptr_DOMNode[0x14])(pDVar4);
      pXVar5 = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
      if ((pXVar5 == (XMLCh *)0x0) || (*pXVar5 == L'\0')) {
        iVar3 = (*pDVar4->_vptr_DOMNode[0x15])(pDVar4);
        pXVar5 = (XMLCh *)CONCAT44(extraout_var_01,iVar3);
        if ((pXVar5 == (XMLCh *)0x0) || (*pXVar5 == L'\0')) goto LAB_002885c9;
      }
      goto LAB_002885c5;
    }
  }
  else {
LAB_002885c5:
    this->fEncodingUsed = pXVar5;
  }
LAB_002885c9:
  pXVar5 = this->fNewLine;
  if (pXVar5 == (XMLCh *)0x0) {
    pXVar6 = L"\n";
  }
  else {
    pXVar6 = L"\n";
    if (*pXVar5 != L'\0') {
      pXVar6 = pXVar5;
    }
  }
  this->fNewLineUsed = pXVar6;
  pXVar5 = L"1.0";
  if (((pDVar4 != (DOMNode *)0x0) &&
      (iVar3 = (*pDVar4->_vptr_DOMNode[0x18])(pDVar4), CONCAT44(extraout_var_02,iVar3) != 0)) &&
     (iVar3 = (*pDVar4->_vptr_DOMNode[0x18])(pDVar4), *(short *)CONCAT44(extraout_var_03,iVar3) != 0
     )) {
    iVar3 = (*pDVar4->_vptr_DOMNode[0x18])(pDVar4);
    pXVar5 = (XMLCh *)CONCAT44(extraout_var_04,iVar3);
  }
  this->fDocumentVersion = pXVar5;
  if (pXVar5 == L"1.1") {
    bVar8 = true;
  }
  else {
    pXVar6 = L"1.1";
    if (pXVar5 == (XMLCh *)0x0) {
LAB_00288665:
      bVar8 = *pXVar6 == L'\0';
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_00288665;
        pXVar5 = pXVar5 + 1;
        XVar2 = *pXVar6;
        pXVar6 = pXVar6 + 1;
      } while (XVar1 == XVar2);
      bVar8 = false;
    }
  }
  this->fIsXml11 = bVar8;
  this->fErrorCount = 0;
  this->fLineFeedInTextNodePrinted = false;
  this->fLastWhiteSpaceInTextNode = 0;
  manager = this->fMemoryManager;
  this_01 = (XMLFormatter *)XMemory::operator_new(0x4090,manager);
  XMLFormatter::XMLFormatter
            (this_01,this->fEncodingUsed,this->fDocumentVersion,&target->super_XMLFormatTarget,
             NoEscapes,UnRep_CharRef,this->fMemoryManager);
  this->fFormatter = this_01;
  processNode(this,nodeToWrite,0);
  (*(target->super_XMLFormatTarget)._vptr_XMLFormatTarget[3])(target);
  XMLFormatter::~XMLFormatter(this_01);
  XMemory::operator_delete((XMemory *)this_01,nodeToWrite);
  uVar7 = CONCAT71((int7)((ulong)manager >> 8),this->fErrorCount == 0);
LAB_002886ef:
  if (this_00 != (LocalFileFormatTarget *)0x0) {
    (*(this_00->super_XMLFormatTarget)._vptr_XMLFormatTarget[1])(this_00);
  }
  return uVar7 & 0xffffffff;
}

Assistant:

bool DOMLSSerializerImpl::write(const DOMNode* nodeToWrite,
                                DOMLSOutput* const destination)
{
    XMLFormatTarget* pTarget=destination->getByteStream();
    Janitor<XMLFormatTarget> janTarget(0);
    if(!pTarget)
    {
        const XMLCh* szSystemId=destination->getSystemId();
        if(!szSystemId)
        {
            //TODO: report error "missing target"
            return false;
        }
        pTarget=new LocalFileFormatTarget(szSystemId, fMemoryManager);
        janTarget.reset(pTarget);
    }
    /**
     * When writing to a LSOutput, the encoding is found by looking at the encoding information
     * that is reachable through the LSOutput and the item to be written (or its owner document) in this order:
     *
     *  1. LSOutput.encoding,
     *  2. Document.inputEncoding,
     *  3. Document.xmlEncoding.
     *
     * If no encoding is reachable through the above properties, a default encoding of "UTF-8" will be used.
     * If the specified encoding is not supported an "unsupported-encoding" fatal error is raised.
     */
    fEncodingUsed = gUTF8;

    const DOMDocument *docu = (nodeToWrite->getNodeType() == DOMNode::DOCUMENT_NODE)?
                              (const DOMDocument*)nodeToWrite : nodeToWrite->getOwnerDocument();

    const XMLCh* lsEncoding=destination->getEncoding();
    if (lsEncoding && *lsEncoding)
    {
        fEncodingUsed = lsEncoding;
    }
    else if (docu)
    {
        const XMLCh* tmpEncoding = docu->getInputEncoding();

        if ( tmpEncoding && *tmpEncoding)
        {
            fEncodingUsed = tmpEncoding;
        }
        else
        {
            tmpEncoding = docu->getXmlEncoding();

            if ( tmpEncoding && *tmpEncoding)
            {
                fEncodingUsed = tmpEncoding;
            }
        }
    }


    /**
     *  The end-of-line sequence of characters to be used in the XML being
     *  written out. The only permitted values are these:
     *     . null
     *
     *  Use a default end-of-line sequence. DOM implementations should choose
     * the default to match the usual convention for text files in the
     * environment being used. Implementations must choose a default
     * sequence that matches one of those allowed by  2.11 "End-of-Line
     * Handling".
     *
     *    CR    The carriage-return character (#xD)
     *    CR-LF The carriage-return and line-feed characters (#xD #xA)
     *    LF    The line-feed character (#xA)
     *
     *  The default value for this attribute is null
     */
    fNewLineUsed = (fNewLine && *fNewLine)? fNewLine : gEOLSeq;

    /**
     *  get Document Version
     */
    fDocumentVersion = (docu && docu->getXmlVersion() && *(docu->getXmlVersion()))?docu->getXmlVersion():XMLUni::fgVersion1_0;
    fIsXml11 = XMLString::equals(fDocumentVersion, XMLUni::fgVersion1_1);

    fErrorCount = 0;

    fLineFeedInTextNodePrinted = false;
    fLastWhiteSpaceInTextNode = 0;

    try
    {
        fFormatter = new (fMemoryManager) XMLFormatter( fEncodingUsed
                                                       ,fDocumentVersion
                                                       ,pTarget
                                                       ,XMLFormatter::NoEscapes
                                                       ,XMLFormatter::UnRep_CharRef
                                                       ,fMemoryManager);
    }
    catch (const TranscodingException& e)
    {
        reportError(nodeToWrite, DOMError::DOM_SEVERITY_FATAL_ERROR, e.getMessage());
        return false;
    }

    try
    {
        Janitor<XMLFormatter> janName(fFormatter);
        processNode(nodeToWrite);
        pTarget->flush();
    }

    //
    // The serialize engine (processNode) throws an exception to abort
    // serialization if
    //
    //   . A fatal error occurs which renders the output ill-formed, or
    //   . Instructed by the application's error handler
    //
    catch (const TranscodingException&)
    {
        pTarget->flush();
        return false;
    }

    catch (const XMLDOMMsg::Codes)
    {
        pTarget->flush();
        return false;
    }
    catch(const OutOfMemoryException&)
    {
        throw;
    }
    catch (...)
    {
        pTarget->flush();
        throw;
    }

    //
    // true if node was successfully serialized and
    // false in case a failure occured and the
    // failure wasn't canceled by the error handler.
    //
    return ((fErrorCount == 0)? true : false);
}